

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O3

int64_t __thiscall
aeron::ClientConductor::addPublication(ClientConductor *this,string *channel,int32_t streamId)

{
  pointer pcVar1;
  string *__args;
  bool bVar2;
  int iVar3;
  long lVar4;
  PublicationStateDefn *pPVar5;
  __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
  __it;
  undefined1 *puVar6;
  __normal_iterator<aeron::ClientConductor::PublicationStateDefn_*,_std::vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>_>
  _Var7;
  long lVar8;
  int64_t registrationId;
  undefined1 *local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  int32_t local_c8;
  PublicationStateDefn *local_c0;
  int32_t local_b8;
  int32_t local_b4;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  int32_t local_90;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  int32_t local_68;
  string *local_60;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  int32_t local_38;
  
  local_b4 = streamId;
  verifyDriverIsActive(this);
  ensureOpen(this);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_adminLock);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  __it._M_current =
       (this->m_publications).
       super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pPVar5 = (this->m_publications).
           super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_88 = local_78;
  pcVar1 = (channel->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + channel->_M_string_length);
  local_58 = local_48;
  local_68 = streamId;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_88,local_88 + local_80);
  local_38 = local_68;
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_58,local_58 + local_50);
  local_c8 = local_38;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_e8,local_e8 + local_e0);
  local_90 = local_c8;
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_b0,local_b0 + local_a8);
  local_c8 = local_90;
  lVar4 = (long)pPVar5 - (long)__it._M_current;
  lVar8 = (lVar4 >> 4) * -0x71c71c71c71c71c7 >> 2;
  local_c0 = pPVar5;
  local_b8 = streamId;
  local_60 = channel;
  if (0 < lVar8) {
    pPVar5 = __it._M_current + lVar8 * 4;
    lVar8 = lVar8 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>
              ::operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                            *)&local_e8,__it);
      _Var7._M_current = __it._M_current;
      if (bVar2) goto LAB_0013ec07;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>
              ::operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                            *)&local_e8,__it._M_current + 1);
      _Var7._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_0013ec07;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>
              ::operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                            *)&local_e8,__it._M_current + 2);
      _Var7._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_0013ec07;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>
              ::operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                            *)&local_e8,__it._M_current + 3);
      _Var7._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_0013ec07;
      __it._M_current = __it._M_current + 4;
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
    lVar4 = (long)local_c0 - (long)pPVar5;
    __it._M_current = pPVar5;
  }
  lVar4 = (lVar4 >> 4) * -0x71c71c71c71c71c7;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var7._M_current = local_c0;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>
                  ::operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                                *)&local_e8,__it), _Var7._M_current = __it._M_current, bVar2))
      goto LAB_0013ec07;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>
            ::operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                          *)&local_e8,__it);
    _Var7._M_current = __it._M_current;
    if (bVar2) goto LAB_0013ec07;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::$_0>::
          operator()((_Iter_pred<aeron::ClientConductor::addPublication(std::__cxx11::string_const&,int)::__0>
                      *)&local_e8,__it);
  _Var7._M_current = local_c0;
  if (bVar2) {
    _Var7._M_current = __it._M_current;
  }
LAB_0013ec07:
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  __args = local_60;
  if (_Var7._M_current ==
      (this->m_publications).
      super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_e8 = (undefined1 *)DriverProxy::addPublication(this->m_driverProxy,local_60,local_b8);
    if ((this->m_epochClock).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    local_b0 = (undefined1 *)(*(this->m_epochClock)._M_invoker)((_Any_data *)&this->m_epochClock);
    std::
    vector<aeron::ClientConductor::PublicationStateDefn,std::allocator<aeron::ClientConductor::PublicationStateDefn>>
    ::emplace_back<std::__cxx11::string_const&,long&,int&,long_long>
              ((vector<aeron::ClientConductor::PublicationStateDefn,std::allocator<aeron::ClientConductor::PublicationStateDefn>>
                *)&this->m_publications,__args,(long *)&local_e8,&local_b4,(longlong *)&local_b0);
    puVar6 = local_e8;
  }
  else {
    puVar6 = (undefined1 *)(_Var7._M_current)->m_registrationId;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return (int64_t)puVar6;
}

Assistant:

std::int64_t ClientConductor::addPublication(const std::string &channel, std::int32_t streamId)
{
    verifyDriverIsActive();
    ensureOpen();

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);
    std::int64_t id;

    auto it = std::find_if(m_publications.begin(), m_publications.end(),
        [channel, streamId](const PublicationStateDefn &entry)
        {
            return (streamId == entry.m_streamId && channel == entry.m_channel);
        });

    if (it == m_publications.end())
    {
        std::int64_t registrationId = m_driverProxy.addPublication(channel, streamId);

        m_publications.emplace_back(channel, registrationId, streamId, m_epochClock());
        id = registrationId;
    }
    else
    {
        id = (*it).m_registrationId;
    }

    return id;
}